

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void term_reconfig(Terminal *term,Conf *conf)

{
  optionalrgb oVar1;
  bidi_cache_entry *pbVar2;
  byte bVar3;
  unsigned_long uVar4;
  truecolour tVar5;
  wchar_t wVar6;
  undefined4 uVar7;
  byte bVar8;
  _Bool _Var9;
  _Bool _Var10;
  _Bool _Var11;
  _Bool _Var12;
  _Bool _Var13;
  _Bool _Var14;
  _Bool _Var15;
  _Bool _Var16;
  _Bool _Var17;
  _Bool _Var18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  bidi_cache_entry *pbVar24;
  char *pcVar25;
  char *__s2;
  Conf *conf_00;
  int iVar26;
  int iVar27;
  ulong uVar28;
  long lVar29;
  bool bVar30;
  
  _Var9 = conf_get_bool(term->conf,0x6c);
  _Var10 = conf_get_bool(conf,0x6c);
  _Var11 = conf_get_bool(term->conf,0x6b);
  _Var12 = conf_get_bool(conf,0x6b);
  _Var13 = conf_get_bool(term->conf,0x7a);
  _Var14 = conf_get_bool(conf,0x7a);
  _Var15 = conf_get_bool(term->conf,0x7b);
  _Var16 = conf_get_bool(conf,0x7b);
  iVar26 = 0;
  bVar8 = 0;
  do {
    bVar3 = bVar8;
    iVar19 = conf_get_int_int(term->conf,0x9d,iVar26);
    iVar20 = conf_get_int_int(conf,0x9d,iVar26);
    iVar26 = iVar26 + 1;
    bVar8 = bVar3 | iVar19 != iVar20;
  } while (iVar26 != 0x100);
  _Var17 = conf_get_bool(term->conf,0x8d);
  _Var18 = conf_get_bool(conf,0x8d);
  if (_Var17 == _Var18) {
    _Var17 = conf_get_bool(term->conf,0x8e);
    _Var18 = conf_get_bool(conf,0x8e);
    if (_Var17 == _Var18) goto LAB_00108552;
  }
  if (term->bidi_cache_size != 0) {
    pbVar24 = term->pre_bidi_cache;
    lVar29 = 8;
    uVar28 = 0;
    do {
      safefree(*(void **)((long)&pbVar24->width + lVar29));
      safefree(*(void **)((long)&term->post_bidi_cache->width + lVar29));
      pbVar24 = term->pre_bidi_cache;
      *(undefined4 *)((long)pbVar24 + lVar29 + -8) = 0xffffffff;
      *(undefined8 *)((long)&pbVar24->width + lVar29) = 0;
      pbVar2 = term->post_bidi_cache;
      *(undefined4 *)((long)pbVar2 + lVar29 + -8) = 0xffffffff;
      *(undefined8 *)((long)&pbVar2->width + lVar29) = 0;
      uVar28 = uVar28 + 1;
      lVar29 = lVar29 + 0x20;
    } while (uVar28 < term->bidi_cache_size);
  }
LAB_00108552:
  pcVar25 = conf_get_str(term->conf,0x69);
  __s2 = conf_get_str(conf,0x69);
  iVar26 = strcmp(pcVar25,__s2);
  if (iVar26 != 0) {
    safefree(term->window_title);
    pcVar25 = dupstr(__s2);
    term->window_title = pcVar25;
    term->wintitle_codepage = L'\xffff';
    term->win_title_pending = true;
    if (term->window_update_pending == false) {
      term->window_update_pending = true;
      queue_toplevel_callback(term_update_callback,term);
    }
  }
  bVar30 = true;
  iVar26 = 0;
  uVar23 = 0;
  do {
    iVar27 = 0;
    do {
      iVar21 = conf_get_int_int(term->conf,0x95,iVar27 + iVar26);
      iVar22 = conf_get_int_int(conf,0x95,iVar27 + iVar26);
      if (iVar21 != iVar22) goto LAB_0010865f;
      iVar27 = iVar27 + 1;
    } while (iVar27 != 3);
    bVar30 = uVar23 < 0x15;
    uVar23 = uVar23 + 1;
    iVar26 = iVar26 + 3;
  } while (uVar23 != 0x16);
  bVar30 = false;
LAB_0010865f:
  conf_free(term->conf);
  conf_00 = conf_copy(conf);
  term->conf = conf_00;
  if (_Var9 != _Var10) {
    _Var9 = conf_get_bool(conf_00,0x6c);
    term->wrap = _Var9;
    term->alt_wrap = _Var9;
  }
  if (_Var11 != _Var12) {
    _Var9 = conf_get_bool(term->conf,0x6b);
    term->dec_om = _Var9;
    term->alt_om = _Var9;
  }
  if (_Var13 != _Var14) {
    _Var9 = conf_get_bool(term->conf,0x7a);
    term->use_bce = _Var9;
    uVar4 = (term->basic_erase_char).attr;
    tVar5 = (term->basic_erase_char).truecolour;
    wVar6 = (term->basic_erase_char).cc_next;
    uVar7 = *(undefined4 *)&(term->basic_erase_char).field_0x1c;
    (term->erase_char).chr = (term->basic_erase_char).chr;
    (term->erase_char).attr = uVar4;
    (term->erase_char).truecolour = tVar5;
    (term->erase_char).cc_next = wVar6;
    *(undefined4 *)&(term->erase_char).field_0x1c = uVar7;
    if (_Var9) {
      oVar1 = (term->curr_truecolour).bg;
      (term->erase_char).attr = (ulong)(uint)(term->curr_attr & 0x3ffff);
      (term->erase_char).truecolour.bg = oVar1;
    }
  }
  if (_Var15 != _Var16) {
    _Var9 = conf_get_bool(term->conf,0x7b);
    term->blink_is_real = _Var9;
  }
  if ((bool)(bVar3 | iVar19 != iVar20)) {
    lVar29 = 0;
    do {
      iVar26 = conf_get_int_int(term->conf,0x9d,(int)lVar29);
      term->wordness[lVar29] = (short)iVar26;
      lVar29 = lVar29 + 1;
    } while (lVar29 != 0x100);
  }
  _Var9 = conf_get_bool(term->conf,0x50);
  if (_Var9) {
    swap_screen(term,L'\0',false,false);
  }
  _Var9 = conf_get_bool(term->conf,0x54);
  if (_Var9) {
    term->cset_attr[0] = L'\xd800';
    term->cset_attr[1] = L'\xd800';
    term->alt_sco_acs = L'\0';
    term->sco_acs = L'\0';
    term->utf = false;
  }
  pcVar25 = conf_get_str(term->conf,0x8c);
  if (pcVar25 == (char *)0x0) {
    term_print_finish(term);
  }
  if (bVar30) {
    palette_reset(term,true);
  }
  term_schedule_tblink(term);
  term_schedule_cblink(term);
  term_copy_stuff_from_conf(term);
  term_update_raw_mouse_mode(term);
  return;
}

Assistant:

void term_reconfig(Terminal *term, Conf *conf)
{
    /*
     * Before adopting the new config, check all those terminal
     * settings which control power-on defaults; and if they've
     * changed, we will modify the current state as well as the
     * default one. The full list is: Auto wrap mode, DEC Origin
     * Mode, BCE, blinking text, character classes.
     */
    bool reset_wrap, reset_decom, reset_bce, reset_tblink, reset_charclass;
    bool palette_changed = false;
    int i;

    reset_wrap = (conf_get_bool(term->conf, CONF_wrap_mode) !=
                  conf_get_bool(conf, CONF_wrap_mode));
    reset_decom = (conf_get_bool(term->conf, CONF_dec_om) !=
                   conf_get_bool(conf, CONF_dec_om));
    reset_bce = (conf_get_bool(term->conf, CONF_bce) !=
                 conf_get_bool(conf, CONF_bce));
    reset_tblink = (conf_get_bool(term->conf, CONF_blinktext) !=
                    conf_get_bool(conf, CONF_blinktext));
    reset_charclass = false;
    for (i = 0; i < 256; i++)
        if (conf_get_int_int(term->conf, CONF_wordness, i) !=
            conf_get_int_int(conf, CONF_wordness, i))
            reset_charclass = true;

    /*
     * If the bidi or shaping settings have changed, flush the bidi
     * cache completely.
     */
    if (conf_get_bool(term->conf, CONF_no_arabicshaping) !=
        conf_get_bool(conf, CONF_no_arabicshaping) ||
        conf_get_bool(term->conf, CONF_no_bidi) !=
        conf_get_bool(conf, CONF_no_bidi)) {
        for (i = 0; i < term->bidi_cache_size; i++) {
            sfree(term->pre_bidi_cache[i].chars);
            sfree(term->post_bidi_cache[i].chars);
            term->pre_bidi_cache[i].width = -1;
            term->pre_bidi_cache[i].chars = NULL;
            term->post_bidi_cache[i].width = -1;
            term->post_bidi_cache[i].chars = NULL;
        }
    }

    {
        const char *old_title = conf_get_str(term->conf, CONF_wintitle);
        const char *new_title = conf_get_str(conf, CONF_wintitle);
        if (strcmp(old_title, new_title)) {
            sfree(term->window_title);
            term->window_title = dupstr(new_title);
            term->wintitle_codepage = DEFAULT_CODEPAGE;
            term->win_title_pending = true;
            term_schedule_update(term);
        }
    }

    /*
     * Just setting conf is sufficient to cause colour setting changes
     * to appear on the next ESC]R palette reset. But we should also
     * check whether any colour settings have been changed, so that
     * they can be updated immediately if they haven't been overridden
     * by some escape sequence.
     */
    {
        int i, j;
        for (i = 0; i < CONF_NCOLOURS; i++) {
            for (j = 0; j < 3; j++)
                if (conf_get_int_int(term->conf, CONF_colours, i*3+j) !=
                    conf_get_int_int(conf, CONF_colours, i*3+j))
                    break;
            if (j < 3) {
                /* Actually enacting the change has to be deferred 
                 * until the new conf is installed. */
                palette_changed = true;
                break;
            }
        }
    }

    conf_free(term->conf);
    term->conf = conf_copy(conf);

    if (reset_wrap)
        term->alt_wrap = term->wrap = conf_get_bool(term->conf, CONF_wrap_mode);
    if (reset_decom)
        term->alt_om = term->dec_om = conf_get_bool(term->conf, CONF_dec_om);
    if (reset_bce) {
        term->use_bce = conf_get_bool(term->conf, CONF_bce);
        set_erase_char(term);
    }
    if (reset_tblink) {
        term->blink_is_real = conf_get_bool(term->conf, CONF_blinktext);
    }
    if (reset_charclass)
        for (i = 0; i < 256; i++)
            term->wordness[i] = conf_get_int_int(term->conf, CONF_wordness, i);

    if (conf_get_bool(term->conf, CONF_no_alt_screen))
        swap_screen(term, 0, false, false);
    if (conf_get_bool(term->conf, CONF_no_remote_charset)) {
        term->cset_attr[0] = term->cset_attr[1] = CSET_ASCII;
        term->sco_acs = term->alt_sco_acs = 0;
        term->utf = false;
    }
    if (!conf_get_str(term->conf, CONF_printer)) {
        term_print_finish(term);
    }
    if (palette_changed)
        term_notify_palette_changed(term);
    term_schedule_tblink(term);
    term_schedule_cblink(term);
    term_copy_stuff_from_conf(term);
    term_update_raw_mouse_mode(term);
}